

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  EffectAnalyzer *pEVar1;
  ulong uVar2;
  bool bVar3;
  
  if (curr->isReturn == true) {
    pEVar1 = this->parent;
    pEVar1->branchesOut = true;
    if (((pEVar1->features).features & 0x40) != 0) {
      pEVar1->hasReturnCallThrow = true;
    }
  }
  bVar3 = wasm::Type::isNull(&curr->target->type);
  if (bVar3) {
    this->parent->trap = true;
  }
  else {
    uVar2 = (curr->target->type).id;
    pEVar1 = this->parent;
    if (((uint)uVar2 & 3) == 2 && 6 < uVar2) {
      pEVar1->implicitTrap = true;
    }
    pEVar1->calls = true;
    if (((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) &&
       (curr->isReturn == false)) {
      pEVar1->throws_ = true;
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }

      parent.calls = true;
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }